

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

void __thiscall
helics::FilterFederate::addFilteredEndpoint(FilterFederate *this,json *block,GlobalFederateId fed)

{
  value_t vVar1;
  json_value jVar2;
  _Base_ptr p_Var3;
  int *piVar4;
  reference pvVar5;
  BasicHandleInfo *pBVar6;
  _Base_ptr p_Var7;
  FilterInfo **fcc;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  initializer_list_t init;
  data local_170;
  data local_160;
  data local_150;
  data local_140;
  data local_130;
  data local_120;
  string local_110;
  string srcFilters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  json eptBlock;
  string local_80;
  data local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  init._M_len = 0;
  init._M_array = (iterator)&local_60;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::array(init);
  pvVar5 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)block,"endpoints");
  vVar1 = (pvVar5->m_data).m_type;
  (pvVar5->m_data).m_type = local_60.m_type;
  jVar2 = (pvVar5->m_data).m_value;
  (pvVar5->m_data).m_value = local_60.m_value;
  local_60.m_type = vVar1;
  local_60.m_value = jVar2;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_60);
  for (p_Var7 = (this->filterCoord)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(this->filterCoord)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    p_Var9 = p_Var7[1]._M_parent;
    pBVar6 = HandleManager::getInterfaceHandle
                       (this->mHandles,(InterfaceHandle)p_Var7[1]._M_color,ENDPOINT);
    if ((pBVar6->handle).fed_id.gid == fed.gid) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&eptBlock,(nullptr_t)0x0);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_130,&pBVar6->key);
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&eptBlock,"name");
      vVar1 = (pvVar5->m_data).m_type;
      (pvVar5->m_data).m_type = local_130.m_type;
      jVar2 = (pvVar5->m_data).m_value;
      (pvVar5->m_data).m_value = local_130.m_value;
      local_130.m_type = vVar1;
      local_130.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_130);
      srcFilters._M_dataplus._M_p._0_4_ = (pBVar6->handle).handle.hid;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<int,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_120,(int *)&srcFilters);
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&eptBlock,"id");
      vVar1 = (pvVar5->m_data).m_type;
      (pvVar5->m_data).m_type = local_120.m_type;
      jVar2 = (pvVar5->m_data).m_value;
      (pvVar5->m_data).m_value = local_120.m_value;
      local_120.m_type = vVar1;
      local_120.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_120);
      if (*(char *)&p_Var9[2]._M_left == '\x01') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&srcFilters,"[",(allocator<char> *)&local_b0);
        p_Var3 = p_Var9->_M_parent;
        for (p_Var8 = *(_Base_ptr *)p_Var9; p_Var8 != p_Var3; p_Var8 = (_Base_ptr)&p_Var8->_M_parent
            ) {
          piVar4 = *(int **)p_Var8;
          if (*(long *)(piVar4 + 4) == 0) {
            CLI::std::__cxx11::to_string(&local_110,*piVar4);
            std::operator+(&local_50,&local_110,':');
            CLI::std::__cxx11::to_string(&local_80,*(int *)(*(long *)p_Var8 + 4));
            std::operator+(&local_b0,&local_50,&local_80);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcFilters,
                   &local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_110);
          }
          else {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcFilters,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(piVar4 + 2)
                  );
          }
          if (*(char *)(*(long *)p_Var8 + 0x99) == '\x01') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcFilters,
                   "(cloning)");
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcFilters
                    ,',');
        }
        if (*(char *)(CONCAT44(srcFilters._M_dataplus._M_p._4_4_,
                               (BaseType)srcFilters._M_dataplus._M_p) + -1 +
                     srcFilters._M_string_length) == ',') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcFilters)
          ;
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcFilters,
                  ']');
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcFilters)
        ;
        pvVar5 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&eptBlock,"srcFilters");
        vVar1 = (pvVar5->m_data).m_type;
        (pvVar5->m_data).m_type = local_140.m_type;
        jVar2 = (pvVar5->m_data).m_value;
        (pvVar5->m_data).m_value = local_140.m_value;
        local_140.m_type = vVar1;
        local_140.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_140);
        std::__cxx11::string::~string((string *)&srcFilters);
      }
      if (*(char *)((long)&p_Var9[2]._M_left + 1) == '\x01') {
        p_Var8 = p_Var9->_M_right;
        if (p_Var8 != (_Base_ptr)0x0) {
          if (p_Var8->_M_left == (_Base_ptr)0x0) {
            CLI::std::__cxx11::to_string(&local_50,p_Var8->_M_color);
            std::operator+(&local_b0,&local_50,':');
            CLI::std::__cxx11::to_string(&local_110,*(int *)&p_Var9->_M_right->field_0x4);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcFilters,&local_b0,&local_110);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_160,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &srcFilters);
            pvVar5 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)&eptBlock,"destFilter");
            vVar1 = (pvVar5->m_data).m_type;
            (pvVar5->m_data).m_type = local_160.m_type;
            jVar2 = (pvVar5->m_data).m_value;
            (pvVar5->m_data).m_value = local_160.m_value;
            local_160.m_type = vVar1;
            local_160.m_value = jVar2;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_160);
            std::__cxx11::string::~string((string *)&srcFilters);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_50);
          }
          else {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_150,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &p_Var8->_M_parent);
            pvVar5 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)&eptBlock,"destFilter");
            vVar1 = (pvVar5->m_data).m_type;
            (pvVar5->m_data).m_type = local_150.m_type;
            jVar2 = (pvVar5->m_data).m_value;
            (pvVar5->m_data).m_value = local_150.m_value;
            local_150.m_type = vVar1;
            local_150.m_value = jVar2;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_150);
          }
        }
        if (p_Var9[1]._M_right != *(_Base_ptr *)(p_Var9 + 2)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcFilters,"[",(allocator<char> *)&local_b0);
          p_Var8 = *(_Base_ptr *)(p_Var9 + 2);
          for (p_Var9 = p_Var9[1]._M_right; p_Var9 != p_Var8; p_Var9 = (_Base_ptr)&p_Var9->_M_parent
              ) {
            piVar4 = *(int **)p_Var9;
            if (*(long *)(piVar4 + 4) == 0) {
              CLI::std::__cxx11::to_string(&local_110,*piVar4);
              std::operator+(&local_50,&local_110,':');
              CLI::std::__cxx11::to_string(&local_80,*(int *)(*(long *)p_Var9 + 4));
              std::operator+(&local_b0,&local_50,&local_80);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &srcFilters,&local_b0);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_80);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_110);
            }
            else {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &srcFilters,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (piVar4 + 2));
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &srcFilters,',');
          }
          if (*(char *)(CONCAT44(srcFilters._M_dataplus._M_p._4_4_,
                                 (BaseType)srcFilters._M_dataplus._M_p) + -1 +
                       srcFilters._M_string_length) == ',') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &srcFilters);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcFilters
                    ,']');
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &srcFilters);
          pvVar5 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)&eptBlock,"cloningdestFilter");
          vVar1 = (pvVar5->m_data).m_type;
          (pvVar5->m_data).m_type = local_170.m_type;
          jVar2 = (pvVar5->m_data).m_value;
          (pvVar5->m_data).m_value = local_170.m_value;
          local_170.m_type = vVar1;
          local_170.m_value = jVar2;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_170);
          std::__cxx11::string::~string((string *)&srcFilters);
        }
      }
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)block,"endpoints");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back(pvVar5,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&eptBlock.m_data);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&eptBlock.m_data);
    }
  }
  return;
}

Assistant:

void FilterFederate::addFilteredEndpoint(nlohmann::json& block, GlobalFederateId fed) const
{
    block["endpoints"] = nlohmann::json::array();
    for (const auto& filt : filterCoord) {
        auto* fc = filt.second.get();
        const auto* ep = mHandles->getInterfaceHandle(filt.first, InterfaceType::ENDPOINT);
        if (ep->getFederateId() != fed) {
            continue;
        }
        nlohmann::json eptBlock;

        eptBlock["name"] = ep->key;
        eptBlock["id"] = ep->handle.handle.baseValue();
        if (fc->hasSourceFilters) {
            std::string srcFilters = "[";
            for (auto& fcc : fc->sourceFilters) {
                if (!fcc->key.empty()) {
                    srcFilters.append(fcc->key);
                } else {
                    srcFilters += std::to_string(fcc->core_id.baseValue()) + ':' +
                        std::to_string(fcc->handle.baseValue());
                }
                if (fcc->cloning) {
                    srcFilters.append("(cloning)");
                }
                srcFilters.push_back(',');
            }
            if (srcFilters.back() == ',') {
                srcFilters.pop_back();
            }
            srcFilters.push_back(']');
            eptBlock["srcFilters"] = srcFilters;
        }
        if (fc->hasDestFilters) {
            if (fc->destFilter != nullptr) {
                if (!fc->destFilter->key.empty()) {
                    eptBlock["destFilter"] = fc->destFilter->key;
                } else {
                    eptBlock["destFilter"] = std::to_string(fc->destFilter->core_id.baseValue()) +
                        ':' + std::to_string(fc->destFilter->handle.baseValue());
                }
            }
            if (!fc->cloningDestFilters.empty()) {
                std::string dcloningFilter = "[";
                for (auto& fcc : fc->cloningDestFilters) {
                    if (!fcc->key.empty()) {
                        dcloningFilter.append(fcc->key);
                    } else {
                        dcloningFilter += std::to_string(fcc->core_id.baseValue()) + ':' +
                            std::to_string(fcc->handle.baseValue());
                    }
                    dcloningFilter.push_back(',');
                }
                if (dcloningFilter.back() == ',') {
                    dcloningFilter.pop_back();
                }
                dcloningFilter.push_back(']');
                eptBlock["cloningdestFilter"] = dcloningFilter;
            }
        }
        block["endpoints"].push_back(std::move(eptBlock));
    }
}